

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

Status adios2sys::SystemTools::Touch(string *filename,bool create)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  Status SVar3;
  
  bVar1 = FileExists(filename);
  if (bVar1) {
    iVar2 = utimensat(-100,(filename->_M_dataplus)._M_p,(timespec *)0x0,0);
    if (iVar2 < 0) {
LAB_006b0a7a:
      SVar3 = Status::POSIX_errno();
      return SVar3;
    }
  }
  else if (create) {
    __stream = (FILE *)Fopen(filename,"a+b");
    if (__stream == (FILE *)0x0) goto LAB_006b0a7a;
    fclose(__stream);
  }
  SVar3.Kind_ = Success;
  SVar3.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
  return SVar3;
}

Assistant:

Status SystemTools::Touch(std::string const& filename, bool create)
{
  if (!SystemTools::FileExists(filename)) {
    if (create) {
      FILE* file = Fopen(filename, "a+b");
      if (file) {
        fclose(file);
        return Status::Success();
      }
      return Status::POSIX_errno();
    } else {
      return Status::Success();
    }
  }
#if defined(_WIN32) && !defined(__CYGWIN__)
  HANDLE h = CreateFileW(Encoding::ToWindowsExtendedPath(filename).c_str(),
                         FILE_WRITE_ATTRIBUTES, FILE_SHARE_WRITE, 0,
                         OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0);
  if (!h) {
    return Status::Windows_GetLastError();
  }
  FILETIME mtime;
  GetSystemTimeAsFileTime(&mtime);
  if (!SetFileTime(h, 0, 0, &mtime)) {
    Status status = Status::Windows_GetLastError();
    CloseHandle(h);
    return status;
  }
  CloseHandle(h);
#elif KWSYS_CXX_HAS_UTIMENSAT
  // utimensat is only available on newer Unixes and macOS 10.13+
  if (utimensat(AT_FDCWD, filename.c_str(), nullptr, 0) < 0) {
    return Status::POSIX_errno();
  }
#else
  // fall back to utimes
  if (utimes(filename.c_str(), nullptr) < 0) {
    return Status::POSIX_errno();
  }
#endif
  return Status::Success();
}